

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O1

int ffgdessll(fitsfile *fptr,int colnum,LONGLONG firstrow,LONGLONG nrows,LONGLONG *length,
             LONGLONG *heapaddr,int *status)

{
  FITSfile *pFVar1;
  tcolumn *ptVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  long byteloc;
  LONGLONG descript8 [2];
  ulong local_50;
  long local_48;
  LONGLONG LStack_40;
  
  local_50 = 0;
  local_48 = 0;
  LStack_40 = 0;
  if (0 < *status) {
    return *status;
  }
  if (fptr->HDUposition == fptr->Fptr->curhdu) {
    if ((fptr->Fptr->datastart == -1) && (iVar4 = ffrdef(fptr,status), 0 < iVar4))
    goto LAB_00149e38;
  }
  else {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  pFVar1 = fptr->Fptr;
  ptVar2 = pFVar1->tableptr;
  lVar5 = (long)colnum;
  if (-1 < ptVar2[lVar5 + -1].tdatatype) {
    *status = 0x13d;
    return 0x13d;
  }
  lVar3 = pFVar1->rowlength;
  byteloc = (firstrow + -1) * lVar3 + pFVar1->datastart + ptVar2[lVar5 + -1].tbcol;
  if ((ptVar2[lVar5 + -1].tform[0] == 'P') || (ptVar2[lVar5 + -1].tform[1] == 'P')) {
    if (0 < nrows) {
      do {
        iVar4 = ffgi4b(fptr,byteloc,2,4,(int *)&local_50,status);
        if (0 < iVar4) goto LAB_00149e3d;
        if ((ulong *)length == (ulong *)0x0) {
          length = (LONGLONG *)0x0;
        }
        else {
          *length = local_50 & 0xffffffff;
          length = (LONGLONG *)((ulong *)length + 1);
        }
        if ((ulong *)heapaddr == (ulong *)0x0) {
          heapaddr = (LONGLONG *)0x0;
        }
        else {
          *heapaddr = local_50 >> 0x20;
          heapaddr = (LONGLONG *)((ulong *)heapaddr + 1);
        }
        byteloc = byteloc + lVar3;
        nrows = nrows + -1;
      } while (nrows != 0);
    }
  }
  else if (0 < nrows) {
    do {
      iVar4 = ffgi8b(fptr,byteloc,2,8,&local_48,status);
      if (0 < iVar4) {
LAB_00149e3d:
        return *status;
      }
      if (length == (LONGLONG *)0x0) {
        length = (LONGLONG *)0x0;
      }
      else {
        *length = local_48;
        length = length + 1;
      }
      if (heapaddr == (LONGLONG *)0x0) {
        heapaddr = (LONGLONG *)0x0;
      }
      else {
        *heapaddr = LStack_40;
        heapaddr = heapaddr + 1;
      }
      byteloc = byteloc + lVar3;
      nrows = nrows + -1;
    } while (nrows != 0);
  }
LAB_00149e38:
  return *status;
}

Assistant:

int ffgdessll(fitsfile *fptr, /* I - FITS file pointer                      */
           int colnum,     /* I - column number (1 = 1st column of table)   */
           LONGLONG firstrow,  /* I - first row  (1 = 1st row of table)         */
           LONGLONG nrows,     /* I - number or rows to read                    */
           LONGLONG *length,   /* O - number of elements in the row         */
           LONGLONG *heapaddr, /* O - heap pointer to the data              */
           int *status)    /* IO - error status                             */
/*
  get (read) a range of variable length vector descriptors from the table.
*/
{
    LONGLONG rowsize, bytepos;
    long  ii;
    unsigned int descript4[2] = {0,0};
    LONGLONG descript8[2] = {0,0};
    tcolumn *colptr;

    if (*status > 0)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               /* rescan header */
            return(*status);

    colptr = (fptr->Fptr)->tableptr;  /* point to first column structure */
    colptr += (colnum - 1);           /* offset to the correct column */

    if (colptr->tdatatype >= 0) {
        *status = NOT_VARI_LEN;
        return(*status);
    }

    rowsize = (fptr->Fptr)->rowlength;
    bytepos = (fptr->Fptr)->datastart + 
                  (rowsize  * (firstrow - 1)) +
                  colptr->tbcol;

    if (colptr->tform[0] == 'P' || colptr->tform[1] == 'P')
    {
        /* read 4-byte descriptors */
        for (ii = 0; ii < nrows; ii++)
        {
	    /* read descriptors */
            if (ffgi4b(fptr, bytepos, 2, 4, (INT32BIT *) descript4, status) <= 0)
	    { 
              if (length) {
                *length =   (LONGLONG) descript4[0];   /* 1st word is the length  */
                length++;
	      }

              if (heapaddr) {
                *heapaddr = (LONGLONG) descript4[1];   /* 2nd word is the address */
                heapaddr++;
	      }
              bytepos += rowsize;
	    }
	    else
	      return(*status);
        }
    }
    else  /* this is for 'Q' columns */
    {
        /* read 8-byte descriptors */
        for (ii = 0; ii < nrows; ii++)
        {
	    /* read descriptors */
	    /* cast to type (long *) even though it is actually (LONGLONG *) */
            if (ffgi8b(fptr, bytepos, 2, 8, (long *) descript8, status) <= 0)
	    { 
              if (length) {
                *length =   descript8[0];   /* 1st word is the length  */
                length++;
	      }

              if (heapaddr) {
                *heapaddr = descript8[1];   /* 2nd word is the address */
                heapaddr++;
	      }
              bytepos += rowsize;
	    }
	    else
	      return(*status);
        }
    }
    return(*status);
}